

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

TextPos __thiscall wasm::WATParser::Lexer::position(Lexer *this,char *c)

{
  size_t sVar1;
  char *p;
  char *pcVar2;
  size_t sVar3;
  TextPos TVar4;
  
  pcVar2 = (this->buffer)._M_str;
  if ((ulong)((long)c - (long)pcVar2) <= (this->buffer)._M_len) {
    sVar1 = 1;
    sVar3 = 0;
    for (; pcVar2 != c; pcVar2 = pcVar2 + 1) {
      sVar3 = sVar3 + 1;
      if (*pcVar2 == '\n') {
        sVar3 = 0;
      }
      sVar1 = sVar1 + (*pcVar2 == '\n');
    }
    TVar4.col = sVar3;
    TVar4.line = sVar1;
    return TVar4;
  }
  __assert_fail("size_t(c - buffer.data()) <= buffer.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/parser/lexer.cpp"
                ,0x47f,"TextPos wasm::WATParser::Lexer::position(const char *) const");
}

Assistant:

TextPos Lexer::position(const char* c) const {
  assert(size_t(c - buffer.data()) <= buffer.size());
  TextPos pos{1, 0};
  for (const char* p = buffer.data(); p != c; ++p) {
    if (*p == '\n') {
      pos.line++;
      pos.col = 0;
    } else {
      pos.col++;
    }
  }
  return pos;
}